

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Matcher<fmt::v5::basic_string_view<wchar_t>_> *
testing::A<fmt::v5::basic_string_view<wchar_t>>(void)

{
  MatcherInterface<fmt::v5::basic_string_view<wchar_t>_> *pMVar1;
  Matcher<fmt::v5::basic_string_view<wchar_t>_> *in_RDI;
  
  pMVar1 = (MatcherInterface<fmt::v5::basic_string_view<wchar_t>_> *)operator_new(8);
  (pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001baf80;
  (in_RDI->super_MatcherBase<fmt::v5::basic_string_view<wchar_t>_>).impl_.value_ = pMVar1;
  (in_RDI->super_MatcherBase<fmt::v5::basic_string_view<wchar_t>_>).impl_.link_.next_ =
       &(in_RDI->super_MatcherBase<fmt::v5::basic_string_view<wchar_t>_>).impl_.link_;
  (in_RDI->super_MatcherBase<fmt::v5::basic_string_view<wchar_t>_>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001baf18;
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }